

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

int __thiscall HevcUnit::serializeBuffer(HevcUnit *this,uint8_t *dstBuffer,uint8_t *dstEnd)

{
  int encodeRez;
  uint8_t *dstEnd_local;
  uint8_t *dstBuffer_local;
  HevcUnit *this_local;
  
  if (this->m_nalBufferLen == 0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ =
         NALUnit::encodeNAL(this->m_nalBuffer,this->m_nalBuffer + this->m_nalBufferLen,dstBuffer,
                            (long)dstEnd - (long)dstBuffer);
    if (this_local._4_4_ == -1) {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int HevcUnit::serializeBuffer(uint8_t* dstBuffer, const uint8_t* dstEnd) const
{
    if (m_nalBufferLen == 0)
        return 0;
    const int encodeRez = NALUnit::encodeNAL(m_nalBuffer, m_nalBuffer + m_nalBufferLen, dstBuffer, dstEnd - dstBuffer);
    if (encodeRez == -1)
        return -1;
    return encodeRez;
}